

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btWheelInfo.cpp
# Opt level: O2

void __thiscall
btWheelInfo::updateWheel(btWheelInfo *this,btRigidBody *chassis,RaycastInfo *raycastInfo)

{
  btScalar bVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 relpos;
  btVector3 local_20;
  
  if ((this->m_raycastInfo).m_isInContact == true) {
    bVar1 = btVector3::dot((btVector3 *)this,&(this->m_raycastInfo).m_wheelDirectionWS);
    local_20 = operator-(&(this->m_raycastInfo).m_contactPointWS,
                         &(chassis->super_btCollisionObject).m_worldTransform.m_origin);
    bVar3 = btRigidBody::getVelocityInLocalPoint(chassis,&local_20);
    if (-0.1 <= bVar1) {
      bVar1 = 10.0;
      bVar2 = 0.0;
    }
    else {
      bVar1 = -1.0 / bVar1;
      bVar2 = (bVar3.m_floats[2] * (this->m_raycastInfo).m_contactNormalWS.m_floats[2] +
              (this->m_raycastInfo).m_contactNormalWS.m_floats[0] * bVar3.m_floats[0] +
              bVar3.m_floats[1] * (this->m_raycastInfo).m_contactNormalWS.m_floats[1]) * bVar1;
    }
    this->m_suspensionRelativeVelocity = bVar2;
    this->m_clippedInvContactDotSuspension = bVar1;
  }
  else {
    (this->m_raycastInfo).m_suspensionLength = this->m_suspensionRestLength1;
    this->m_suspensionRelativeVelocity = 0.0;
    bVar3 = operator-(&(this->m_raycastInfo).m_wheelDirectionWS);
    *&(this->m_raycastInfo).m_contactNormalWS.m_floats = bVar3.m_floats;
    this->m_clippedInvContactDotSuspension = 1.0;
  }
  return;
}

Assistant:

void	btWheelInfo::updateWheel(const btRigidBody& chassis,RaycastInfo& raycastInfo)
{
	(void)raycastInfo;

	
	if (m_raycastInfo.m_isInContact)

	{
		btScalar	project= m_raycastInfo.m_contactNormalWS.dot( m_raycastInfo.m_wheelDirectionWS );
		btVector3	 chassis_velocity_at_contactPoint;
		btVector3 relpos = m_raycastInfo.m_contactPointWS - chassis.getCenterOfMassPosition();
		chassis_velocity_at_contactPoint = chassis.getVelocityInLocalPoint( relpos );
		btScalar projVel = m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );
		if ( project >= btScalar(-0.1))
		{
			m_suspensionRelativeVelocity = btScalar(0.0);
			m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / project;
			m_suspensionRelativeVelocity = projVel * inv;
			m_clippedInvContactDotSuspension = inv;
		}
		
	}

	else	// Not in contact : position wheel in a nice (rest length) position
	{
		m_raycastInfo.m_suspensionLength = this->getSuspensionRestLength();
		m_suspensionRelativeVelocity = btScalar(0.0);
		m_raycastInfo.m_contactNormalWS = -m_raycastInfo.m_wheelDirectionWS;
		m_clippedInvContactDotSuspension = btScalar(1.0);
	}
}